

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O1

V2f __thiscall
Imf_3_4::CubeMap::pixelPosition
          (CubeMap *this,CubeMapFace face,Box2i *dataWindow,V2f *positionInFace)

{
  V2f VVar1;
  int iVar2;
  V2f *pos;
  int iVar3;
  float in_XMM0_Da;
  float in_XMM0_Db;
  float fVar4;
  
  iVar3 = ((dataWindow->max).x - (dataWindow->min).x) + 1;
  iVar2 = (((dataWindow->max).y - (dataWindow->min).y) + 1) / 6;
  if (iVar3 <= iVar2) {
    iVar2 = iVar3;
  }
  *(undefined8 *)this = 0;
  if (CUBEFACE_NEG_Z < face) goto LAB_00177332;
  iVar3 = iVar2 + iVar2 * face + -1;
  switch(face) {
  case CUBEFACE_POS_X:
    fVar4 = positionInFace->y + 0.0;
    break;
  case CUBEFACE_NEG_X:
    fVar4 = (float)(iVar2 + -1) - positionInFace->y;
    break;
  default:
    fVar4 = positionInFace->x + 0.0;
    goto LAB_001772ff;
  case CUBEFACE_NEG_Y:
    *(float *)this = positionInFace->x + 0.0;
    in_XMM0_Da = (float)(int)(iVar2 * face) + positionInFace->y;
    goto LAB_0017732d;
  case CUBEFACE_POS_Z:
    fVar4 = (float)(iVar2 + -1) - positionInFace->x;
LAB_001772ff:
    *(float *)this = fVar4;
    in_XMM0_Da = (float)iVar3 - positionInFace->y;
    goto LAB_0017732d;
  }
  *(float *)this = fVar4;
  in_XMM0_Da = (float)iVar3 - positionInFace->x;
LAB_0017732d:
  *(float *)(this + 4) = in_XMM0_Da;
LAB_00177332:
  VVar1.y = in_XMM0_Db;
  VVar1.x = in_XMM0_Da;
  return VVar1;
}

Assistant:

V2f
pixelPosition (CubeMapFace face, const Box2i& dataWindow, V2f positionInFace)
{
    Box2i dwf = dataWindowForFace (face, dataWindow);
    V2f   pos (0, 0);

    switch (face)
    {
        case CUBEFACE_POS_X:

            pos.x = dwf.min.x + positionInFace.y;
            pos.y = dwf.max.y - positionInFace.x;
            break;

        case CUBEFACE_NEG_X:

            pos.x = dwf.max.x - positionInFace.y;
            pos.y = dwf.max.y - positionInFace.x;
            break;

        case CUBEFACE_POS_Y:

            pos.x = dwf.min.x + positionInFace.x;
            pos.y = dwf.max.y - positionInFace.y;
            break;

        case CUBEFACE_NEG_Y:

            pos.x = dwf.min.x + positionInFace.x;
            pos.y = dwf.min.y + positionInFace.y;
            break;

        case CUBEFACE_POS_Z:

            pos.x = dwf.max.x - positionInFace.x;
            pos.y = dwf.max.y - positionInFace.y;
            break;

        case CUBEFACE_NEG_Z:

            pos.x = dwf.min.x + positionInFace.x;
            pos.y = dwf.max.y - positionInFace.y;
            break;
    }

    return pos;
}